

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

String * __thiscall kj::TaskSet::trace(String *__return_storage_ptr__,TaskSet *this)

{
  Task *pTVar1;
  char *in_RCX;
  String local_70;
  Own<kj::TaskSet::Task> *local_48;
  Own<kj::TaskSet::Task> *task;
  Maybe<kj::Own<kj::TaskSet::Task>_> *ptr;
  Vector<kj::String> traces;
  TaskSet *this_local;
  
  traces.builder.disposer = (ArrayDisposer *)this;
  Vector<kj::String>::Vector((Vector<kj::String> *)&ptr);
  task = &(this->tasks).ptr;
  while( true ) {
    local_48 = _::readMaybe<kj::TaskSet::Task>((Maybe<kj::Own<kj::TaskSet::Task>_> *)task);
    if (local_48 == (Own<kj::TaskSet::Task> *)0x0) break;
    pTVar1 = Own<kj::TaskSet::Task>::get(local_48);
    _::Event::trace(&local_70,&pTVar1->super_Event);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)&ptr,&local_70);
    String::~String(&local_70);
    pTVar1 = Own<kj::TaskSet::Task>::get(local_48);
    task = &(pTVar1->next).ptr;
  }
  strArray<kj::Vector<kj::String>&>
            (__return_storage_ptr__,(kj *)&ptr,
             (Vector<kj::String> *)"\n============================================\n",in_RCX);
  Vector<kj::String>::~Vector((Vector<kj::String> *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

kj::String TaskSet::trace() {
  kj::Vector<kj::String> traces;

  Maybe<Own<Task>>* ptr = &tasks;
  for (;;) {
    KJ_IF_MAYBE(task, *ptr) {
      traces.add(task->get()->trace());
      ptr = &task->get()->next;
    } else {
      break;
    }
  }